

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O1

int __thiscall FTextureManager::CountTiles(FTextureManager *this,void *tiles)

{
  int iVar1;
  
  iVar1 = 0;
  if ((*tiles == 1) &&
     (iVar1 = (*(int *)((long)tiles + 0xc) - *(int *)((long)tiles + 8)) + 1,
     *(int *)((long)tiles + 0xc) < *(int *)((long)tiles + 8))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FTextureManager::CountTiles (void *tiles)
{
	int version = LittleLong(*(DWORD *)tiles);
	if (version != 1)
	{
		return 0;
	}

	int tilestart = LittleLong(((DWORD *)tiles)[2]);
	int tileend = LittleLong(((DWORD *)tiles)[3]);

	return tileend >= tilestart ? tileend - tilestart + 1 : 0;
}